

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

void __thiscall
Lodtalk::MethodSemanticAnalysis::inlineBlock
          (MethodSemanticAnalysis *this,Node *node,int argumentCount)

{
  int iVar1;
  size_t sVar2;
  Node *location;
  Node *this_00;
  
  location = node;
  iVar1 = (*node->_vptr_Node[5])(node);
  if ((char)iVar1 != '\0') {
    if (-1 < argumentCount) {
      this_00 = node;
      sVar2 = AST::FunctionalNode::getArgumentCount((FunctionalNode *)node);
      if ((int)sVar2 != argumentCount) {
        AbstractASTVisitor::error
                  ((AbstractASTVisitor *)this_00,location,
                   "this block has an invalid number of parameters.");
      }
    }
    (*node->_vptr_Node[10])(node,1);
  }
  (*node->_vptr_Node[2])(node,this);
  return;
}

Assistant:

void MethodSemanticAnalysis::inlineBlock(Node *node, int argumentCount)
{
    if(node->isBlockExpression())
    {
        auto block = reinterpret_cast<BlockExpression*> (node);
        if(argumentCount >= 0 && (int)block->getArgumentCount() != argumentCount)
            error(node, "this block has an invalid number of parameters.");

        if(block)
            block->setInlined(true);
    }

    node->acceptVisitor(this);
}